

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *p)

{
  uint *puVar1;
  uint *p1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  if (p->pPars->fCheckMiter == 0) {
    uVar4 = 0;
  }
  else {
    if (p->vCoSimInfo == (Vec_Ptr_t *)0x0) {
      __assert_fail("p->vCoSimInfo != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                    ,0x24e,"int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *)");
    }
    iVar7 = p->pAig->vCos->nSize;
    iVar3 = p->pAig->nRegs;
    if (p->pPars->fDualOut == 0) {
      if (iVar3 < iVar7) {
        lVar8 = 0;
        do {
          if (p->vCoSimInfo->nSize <= lVar8) goto LAB_0063c6a4;
          puVar1 = (uint *)p->vCoSimInfo->pArray[lVar8];
          iVar7 = p->nWords;
          iVar3 = Cec_ManSimCompareConst(puVar1,iVar7);
          if (iVar3 == 0) {
            if (p->iOut == -1) {
              p->iOut = (int)lVar8;
              iVar7 = Cec_ManSimCompareConstFirstBit(puVar1,iVar7);
              Cec_ManSimSavePattern(p,iVar7);
            }
            if (p->pCexes == (void **)0x0) {
              ppvVar5 = (void **)calloc((long)p->pAig->vCos->nSize - (long)p->pAig->nRegs,8);
              p->pCexes = ppvVar5;
            }
            if (p->pCexes[lVar8] == (void *)0x0) {
              p->nOuts = p->nOuts + 1;
              p->pCexes[lVar8] = (void *)0x1;
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (long)p->pAig->vCos->nSize - (long)p->pAig->nRegs);
      }
    }
    else {
      if ((iVar7 - iVar3 & 1U) != 0) {
        __assert_fail("(Gia_ManPoNum(p->pAig) & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                      ,0x252,"int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *)");
      }
      if (p->pAig->nRegs < p->pAig->vCos->nSize) {
        iVar7 = 0;
        lVar8 = 0;
        do {
          lVar6 = (long)p->vCoSimInfo->nSize;
          if ((lVar6 <= lVar8) || (lVar6 <= lVar8 + 1)) {
LAB_0063c6a4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar5 = p->vCoSimInfo->pArray;
          puVar1 = (uint *)ppvVar5[lVar8];
          p1 = (uint *)ppvVar5[lVar8 + 1];
          iVar3 = p->nWords;
          iVar2 = Cec_ManSimCompareEqual(puVar1,p1,iVar3);
          if (iVar2 == 0) {
            if (p->iOut == -1) {
              p->iOut = iVar7;
              iVar3 = Cec_ManSimCompareEqualFirstBit(puVar1,p1,iVar3);
              Cec_ManSimSavePattern(p,iVar3);
            }
            if (p->pCexes == (void **)0x0) {
              ppvVar5 = (void **)calloc((long)((p->pAig->vCos->nSize - p->pAig->nRegs) / 2),8);
              p->pCexes = ppvVar5;
            }
            if (*(long *)((long)p->pCexes + lVar8 * 4) == 0) {
              p->nOuts = p->nOuts + 1;
              *(undefined8 *)((long)p->pCexes + lVar8 * 4) = 1;
            }
          }
          iVar7 = iVar7 + 1;
          lVar8 = lVar8 + 2;
        } while ((int)lVar8 < p->pAig->vCos->nSize - p->pAig->nRegs);
      }
    }
    uVar4 = (uint)(p->pCexes != (void **)0x0);
  }
  return uVar4;
}

Assistant:

int Cec_ManSimAnalyzeOutputs( Cec_ManSim_t * p )
{
    unsigned * pInfo, * pInfo2;
    int i;
    if ( !p->pPars->fCheckMiter )
        return 0;
    assert( p->vCoSimInfo != NULL );
    // compare outputs with 0
    if ( p->pPars->fDualOut )
    {
        assert( (Gia_ManPoNum(p->pAig) & 1) == 0 );
        for ( i = 0; i < Gia_ManPoNum(p->pAig); i++ )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, i );
            pInfo2 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, ++i );
            if ( !Cec_ManSimCompareEqual( pInfo, pInfo2, p->nWords ) )
            {
                if ( p->iOut == -1 )
                {
                    p->iOut = i/2;
                    Cec_ManSimSavePattern( p, Cec_ManSimCompareEqualFirstBit(pInfo, pInfo2, p->nWords) );
                }
                if ( p->pCexes == NULL )
                    p->pCexes = ABC_CALLOC( void *, Gia_ManPoNum(p->pAig)/2 );
                if ( p->pCexes[i/2] == NULL )
                {
                    p->nOuts++;
                    p->pCexes[i/2] = (void *)1;
                }
            }
        }
    }
    else
    {
        for ( i = 0; i < Gia_ManPoNum(p->pAig); i++ )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, i );
            if ( !Cec_ManSimCompareConst( pInfo, p->nWords ) )
            {
                if ( p->iOut == -1 )
                {
                    p->iOut = i;
                    Cec_ManSimSavePattern( p, Cec_ManSimCompareConstFirstBit(pInfo, p->nWords) );
                }
                if ( p->pCexes == NULL )
                    p->pCexes = ABC_CALLOC( void *, Gia_ManPoNum(p->pAig) );
                if ( p->pCexes[i] == NULL )
                {
                    p->nOuts++;
                    p->pCexes[i] = (void *)1;
                }
            }
        }
    }
    return p->pCexes != NULL;
}